

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O0

void __thiscall
rate_adaptive_code_from_colptr_rowIdx_equals_not_equals_operators_Test::TestBody
          (rate_adaptive_code_from_colptr_rowIdx_equals_not_equals_operators_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_230;
  AssertHelper local_210;
  Message local_208;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1c8;
  Message local_1c0;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_180;
  Message local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_138;
  Message local_130;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_;
  undefined1 local_100 [8];
  RateAdaptiveCode<unsigned_short> H2;
  RateAdaptiveCode<unsigned_short> H1;
  rate_adaptive_code_from_colptr_rowIdx_equals_not_equals_operators_Test *this_local;
  
  anon_unknown.dwarf_50475::get_code_big_wra();
  anon_unknown.dwarf_50475::get_code_big_wra();
  local_121 = LDPC4QKD::RateAdaptiveCode<unsigned_short>::operator==
                        ((RateAdaptiveCode<unsigned_short> *)&H2.n_ra_rows,
                         (RateAdaptiveCode<unsigned_short> *)local_100);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_120,(AssertionResult *)"H1 != H2",
               "true","false",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_169 = LDPC4QKD::RateAdaptiveCode<unsigned_short>::operator==
                        ((RateAdaptiveCode<unsigned_short> *)&H2.n_ra_rows,
                         (RateAdaptiveCode<unsigned_short> *)local_100);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_168,(AssertionResult *)"H1 == H2",
               "false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x139,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::set_rate
            ((RateAdaptiveCode<unsigned_short> *)&H2.n_ra_rows,1);
  bVar1 = LDPC4QKD::RateAdaptiveCode<unsigned_short>::operator==
                    ((RateAdaptiveCode<unsigned_short> *)&H2.n_ra_rows,
                     (RateAdaptiveCode<unsigned_short> *)local_100);
  local_1b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1b0,(AssertionResult *)"H1 == H2",
               "true","false",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__3.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x13b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  bVar1 = LDPC4QKD::RateAdaptiveCode<unsigned_short>::operator==
                    ((RateAdaptiveCode<unsigned_short> *)&H2.n_ra_rows,
                     (RateAdaptiveCode<unsigned_short> *)local_100);
  local_1f9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_230,(internal *)local_1f8,(AssertionResult *)"H1 != H2","false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_230);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x13c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::~RateAdaptiveCode
            ((RateAdaptiveCode<unsigned_short> *)local_100);
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::~RateAdaptiveCode
            ((RateAdaptiveCode<unsigned_short> *)&H2.n_ra_rows);
  return;
}

Assistant:

TEST(rate_adaptive_code_from_colptr_rowIdx, equals_not_equals_operators) {
    auto H1 = get_code_big_wra();
    auto H2 = get_code_big_wra();
    EXPECT_FALSE(H1 != H2);
    EXPECT_TRUE(H1 == H2);
    H1.set_rate(1);
    EXPECT_FALSE(H1 == H2);
    EXPECT_TRUE(H1 != H2);
}